

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectAggregateHashTable::AddChunk
          (PerfectAggregateHashTable *this,DataChunk *groups,DataChunk *payload)

{
  Vector *addresses;
  data_ptr_t __s;
  idx_t iVar1;
  data_ptr_t pdVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  ulong params;
  byte bVar4;
  PerfectAggregateHashTable *pPVar5;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> uVar6;
  byte bVar7;
  int8_t iVar8;
  uint16_t uVar9;
  int16_t iVar10;
  uint32_t uVar11;
  int32_t iVar12;
  reference pvVar13;
  reference this_00;
  reference this_01;
  int64_t iVar14;
  uint64_t uVar15;
  TupleDataLayout *pTVar16;
  reference aggr;
  AggregateFilterData *filter_data;
  InvalidInputException *this_02;
  InternalException *this_03;
  idx_t iVar17;
  ulong uVar18;
  idx_t iVar19;
  idx_t aggr_idx;
  idx_t iVar20;
  allocator local_c9;
  PerfectAggregateHashTable *local_c8;
  RowOperationsState row_state;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [6];
  string local_50;
  
  addresses = &this->addresses;
  __s = (this->addresses).data;
  switchD_014c69ad::default(__s,0,groups->count << 3);
  iVar20 = this->total_required_bits;
  local_c8 = this;
  for (uVar18 = 0; pPVar5 = local_c8,
      uVar18 < (ulong)(((long)(groups->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(groups->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar18 = uVar18 + 1)
  {
    pvVar13 = vector<unsigned_long,_true>::get<true>(&this->required_bits,uVar18);
    iVar20 = iVar20 - *pvVar13;
    this_00 = vector<duckdb::Vector,_true>::get<true>(&groups->data,uVar18);
    this_01 = vector<duckdb::Value,_true>::get<true>(&this->group_minima,uVar18);
    iVar1 = groups->count;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&row_state);
    Vector::ToUnifiedFormat(this_00,iVar1,(UnifiedVectorFormat *)&row_state);
    uVar6 = row_state.addresses;
    bVar4 = (byte)iVar20;
    switch((this_00->type).physical_type_) {
    case UINT8:
      bVar7 = Value::GetValueUnsafe<unsigned_char>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(ulong *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               (((ulong)*(byte *)((long)uVar6.
                                        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                        .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl
                                 + iVar17) - (ulong)bVar7) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(ulong *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 (((ulong)*(byte *)((long)uVar6.
                                          super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                          .super__Head_base<0UL,_duckdb::Vector_*,_false>.
                                          _M_head_impl + iVar17) - (ulong)bVar7) + 1 <<
                 (bVar4 & 0x3f));
          }
        }
      }
      break;
    case INT8:
      iVar8 = Value::GetValueUnsafe<signed_char>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(long *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               (((long)*(char *)((long)uVar6.
                                       super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                       .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl
                                + iVar17) - (long)iVar8) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(long *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 (((long)*(char *)((long)uVar6.
                                         super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                         .super__Head_base<0UL,_duckdb::Vector_*,_false>.
                                         _M_head_impl + iVar17) - (long)iVar8) + 1 << (bVar4 & 0x3f)
                 );
          }
        }
      }
      break;
    case UINT16:
      uVar9 = Value::GetValueUnsafe<unsigned_short>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(ulong *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               (((ulong)*(ushort *)
                         ((long)uVar6.
                                super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                         iVar17 * 2) - (ulong)uVar9) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(ulong *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 (((ulong)*(ushort *)
                           ((long)uVar6.
                                  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                  .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                           iVar17 * 2) - (ulong)uVar9) + 1 << (bVar4 & 0x3f));
          }
        }
      }
      break;
    case INT16:
      iVar10 = Value::GetValueUnsafe<short>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(long *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               (((long)*(short *)((long)uVar6.
                                        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                        .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl
                                 + iVar17 * 2) - (long)iVar10) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(long *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 (((long)*(short *)((long)uVar6.
                                          super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                          .super__Head_base<0UL,_duckdb::Vector_*,_false>.
                                          _M_head_impl + iVar17 * 2) - (long)iVar10) + 1 <<
                 (bVar4 & 0x3f));
          }
        }
      }
      break;
    case UINT32:
      uVar11 = Value::GetValueUnsafe<unsigned_int>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(ulong *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               ((ulong)((*(int *)((long)uVar6.
                                        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                        .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl
                                 + iVar17 * 4) - uVar11) + 1) << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(ulong *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 ((ulong)((*(int *)((long)uVar6.
                                          super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                          .super__Head_base<0UL,_duckdb::Vector_*,_false>.
                                          _M_head_impl + iVar17 * 4) - uVar11) + 1) <<
                 (bVar4 & 0x3f));
          }
        }
      }
      break;
    case INT32:
      iVar12 = Value::GetValueUnsafe<int>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(long *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               ((long)((*(int *)((long)uVar6.
                                       super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                       .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl
                                + iVar17 * 4) - iVar12) + 1) << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(long *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 ((long)((*(int *)((long)uVar6.
                                         super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                         .super__Head_base<0UL,_duckdb::Vector_*,_false>.
                                         _M_head_impl + iVar17 * 4) - iVar12) + 1) << (bVar4 & 0x3f)
                 );
          }
        }
      }
      break;
    case UINT64:
      uVar15 = Value::GetValueUnsafe<unsigned_long>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(uint64_t *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               ((*(long *)((long)uVar6.
                                 super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                 .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                          iVar17 * 8) - uVar15) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(uint64_t *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 ((*(long *)((long)uVar6.
                                   super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                   .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                            iVar17 * 8) - uVar15) + 1 << (bVar4 & 0x3f));
          }
        }
      }
      break;
    case INT64:
      iVar14 = Value::GetValueUnsafe<long>(this_01);
      if ((unsigned_long *)local_b0[0]._0_8_ == (unsigned_long *)0x0) {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          *(long *)(__s + iVar19 * 8) =
               *(long *)(__s + iVar19 * 8) +
               ((*(long *)((long)uVar6.
                                 super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                 .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                          iVar17 * 8) - iVar14) + 1 << (bVar4 & 0x3f));
        }
      }
      else {
        for (iVar19 = 0; iVar1 != iVar19; iVar19 = iVar19 + 1) {
          iVar17 = iVar19;
          if ((row_state.allocator)->allocator != (Allocator *)0x0) {
            iVar17 = (idx_t)*(uint *)((long)&(row_state.allocator)->allocator->allocate_function +
                                     iVar19 * 4);
          }
          if ((*(ulong *)(local_b0[0]._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f)
              & 1) != 0) {
            *(long *)(__s + iVar19 * 8) =
                 *(long *)(__s + iVar19 * 8) +
                 ((*(long *)((long)uVar6.
                                   super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                                   .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl +
                            iVar17 * 8) - iVar14) + 1 << (bVar4 & 0x3f));
          }
        }
      }
      break;
    default:
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unsupported group type for perfect aggregate hash table",
                 &local_c9);
      InternalException::InternalException(this_03,&local_50);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&row_state);
  }
  pdVar2 = local_c8->data;
  _Var3._M_head_impl =
       (local_c8->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  uVar18 = 0;
  while( true ) {
    if (groups->count <= uVar18) {
      pTVar16 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                          (&(local_c8->super_BaseAggregateHashTable).layout_ptr);
      row_state.allocator =
           unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
           operator*(&pPVar5->aggregate_allocator);
      row_state.addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
           (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
      local_c8 = (PerfectAggregateHashTable *)&(pPVar5->super_BaseAggregateHashTable).filter_set;
      iVar20 = 0;
      for (uVar18 = 0;
          uVar18 < (ulong)(((long)(pTVar16->aggregates).
                                  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  .
                                  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar16->aggregates).
                                 super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                 .
                                 super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x160);
          uVar18 = uVar18 + 1) {
        aggr = vector<duckdb::AggregateObject,_true>::get<true>(&pTVar16->aggregates,uVar18);
        iVar1 = aggr->child_count;
        if (aggr->filter == (Expression *)0x0) {
          RowOperations::UpdateStates(&row_state,aggr,addresses,payload,iVar20,payload->count);
        }
        else {
          filter_data = AggregateFilterDataSet::GetFilterData
                                  ((AggregateFilterDataSet *)local_c8,uVar18);
          RowOperations::UpdateFilteredStates(&row_state,filter_data,aggr,addresses,payload,iVar20);
        }
        VectorOperations::AddInPlace(addresses,aggr->payload_size,payload->count);
        iVar20 = iVar20 + iVar1;
      }
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                (&row_state.addresses.
                  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
      return;
    }
    params = *(ulong *)(__s + uVar18 * 8);
    if (local_c8->total_groups <= params) break;
    _Var3._M_head_impl[params] = true;
    *(data_ptr_t *)(__s + uVar18 * 8) = pdVar2 + params * local_c8->tuple_size;
    uVar18 = uVar18 + 1;
  }
  this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&row_state,
             "Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This likely means that the statistics in your data source are corrupt.\n* PRAGMA disable_optimizer to disable optimizations that rely on correct statistics"
             ,(allocator *)&local_50);
  InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
            (this_02,(string *)&row_state,params,local_c8->total_groups);
  __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PerfectAggregateHashTable::AddChunk(DataChunk &groups, DataChunk &payload) {
	// first we need to find the location in the HT of each of the groups
	auto address_data = FlatVector::GetData<uintptr_t>(addresses);
	// zero-initialize the address data
	memset(address_data, 0, groups.size() * sizeof(uintptr_t));
	D_ASSERT(groups.ColumnCount() == group_minima.size());

	// then compute the actual group location by iterating over each of the groups
	idx_t current_shift = total_required_bits;
	for (idx_t i = 0; i < groups.ColumnCount(); i++) {
		current_shift -= required_bits[i];
		ComputeGroupLocation(groups.data[i], group_minima[i], address_data, current_shift, groups.size());
	}
	// now we have the HT entry number for every tuple
	// compute the actual pointer to the data by adding it to the base HT pointer and multiplying by the tuple size
	for (idx_t i = 0; i < groups.size(); i++) {
		const auto group = address_data[i];
		if (group >= total_groups) {
			throw InvalidInputException("Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This "
			                            "likely means that the statistics in your data source are corrupt.\n* PRAGMA "
			                            "disable_optimizer to disable optimizations that rely on correct statistics",
			                            group, total_groups);
		}
		group_is_set[group] = true;
		address_data[i] = uintptr_t(data) + group * tuple_size;
	}

	// after finding the group location we update the aggregates
	idx_t payload_idx = 0;
	auto &aggregates = layout_ptr->GetAggregates();
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t aggr_idx = 0; aggr_idx < aggregates.size(); aggr_idx++) {
		auto &aggregate = aggregates[aggr_idx];
		auto input_count = (idx_t)aggregate.child_count;
		if (aggregate.filter) {
			RowOperations::UpdateFilteredStates(row_state, filter_set.GetFilterData(aggr_idx), aggregate, addresses,
			                                    payload, payload_idx);
		} else {
			RowOperations::UpdateStates(row_state, aggregate, addresses, payload, payload_idx, payload.size());
		}
		// move to the next aggregate
		payload_idx += input_count;
		VectorOperations::AddInPlace(addresses, UnsafeNumericCast<int64_t>(aggregate.payload_size), payload.size());
	}
}